

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_union_struct
               (flatcc_json_printer_t *ctx,flatcc_json_printer_union_descriptor_t *ud,
               flatcc_json_printer_struct_f *pf)

{
  long lVar1;
  char *__s;
  ulong __n;
  char *pcVar2;
  size_t __n_00;
  
  ctx->level = ctx->level + 1;
  pcVar2 = ctx->p;
  ctx->p = pcVar2 + 1;
  *pcVar2 = '{';
  (*pf)(ctx,(void *)((ulong)*ud->member + (long)ud->member));
  pcVar2 = ctx->p;
  if (ctx->indent != '\0') {
    ctx->p = pcVar2 + 1;
    *pcVar2 = '\n';
    lVar1 = (long)ctx->level + -1;
    ctx->level = (int)lVar1;
    __n = (ulong)ctx->indent * lVar1;
    pcVar2 = ctx->pflush;
    __s = ctx->p;
    if (pcVar2 < __s + __n) {
      if (pcVar2 <= __s) {
        (*ctx->flush)(ctx,0);
        pcVar2 = ctx->pflush;
        __s = ctx->p;
      }
      __n_00 = (long)pcVar2 - (long)__s;
      if (__n_00 < __n) {
        do {
          memset(__s,0x20,__n_00);
          ctx->p = ctx->p + __n_00;
          __n = __n - __n_00;
          (*ctx->flush)(ctx,0);
          __s = ctx->p;
          __n_00 = (long)ctx->pflush - (long)__s;
        } while (__n_00 < __n);
      }
    }
    memset(__s,0x20,__n);
    pcVar2 = ctx->p + __n;
  }
  ctx->p = pcVar2 + 1;
  *pcVar2 = '}';
  return;
}

Assistant:

void flatcc_json_printer_union_struct(flatcc_json_printer_t *ctx,
        flatcc_json_printer_union_descriptor_t *ud,
        flatcc_json_printer_struct_f pf)
{
    print_start('{');
    pf(ctx, read_uoffset_ptr(ud->member));
    print_end('}');
}